

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

Frc_Man_t * Frc_ManStartSimple(Gia_Man_t *pGia)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Frc_Man_t *pFVar6;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  uint *puVar7;
  Gia_Obj_t *pGVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int local_5c;
  
  Gia_ManCreateRefs(pGia);
  pFVar6 = (Frc_Man_t *)calloc(1,0x38);
  pFVar6->pGia = pGia;
  pFVar6->nRegs = pGia->nRegs;
  p = Vec_IntAlloc(pGia->vCis->nSize);
  pFVar6->vCis = p;
  p_00 = Vec_IntAlloc(pGia->vCos->nSize);
  pFVar6->vCos = p_00;
  iVar11 = pGia->vCos->nSize;
  uVar1 = pGia->nObjs * 10 + iVar11 * 2 + ~(pGia->vCis->nSize + iVar11) * 4;
  pFVar6->nObjData = uVar1;
  puVar7 = (uint *)calloc((long)(int)uVar1,4);
  pFVar6->pObjData = (int *)puVar7;
  pGVar8 = pGia->pObjs;
  pGVar8->Value = 0;
  *puVar7 = *puVar7 & 0xf;
  uVar2 = Gia_ObjRefNum(pGia,pGVar8);
  puVar7[1] = uVar2;
  iVar11 = uVar2 + (*puVar7 >> 4);
  pFVar6->nObjs = 1;
  iVar10 = 1;
  while( true ) {
    uVar2 = iVar11 + 6;
    if (pGia->vCis->nSize <= iVar10 + -1) break;
    pGVar8 = Gia_ManCi(pGia,iVar10 + -1);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    pGVar8->Value = uVar2;
    Vec_IntPush(p,uVar2);
    puVar7[(long)(int)uVar2 + 3] = uVar2;
    puVar7[(int)uVar2] = puVar7[(int)uVar2] & 0xf;
    uVar3 = Gia_ObjRefNum(pGia,pGVar8);
    puVar7[(long)(int)uVar2 + 1] = uVar3;
    uVar5 = puVar7[(int)uVar2];
    puVar7[(int)uVar2] = uVar5 & 0xfffffffe;
    iVar11 = (uVar5 >> 4) + uVar3 + uVar2;
    iVar10 = iVar10 + 1;
    pFVar6->nObjs = iVar10;
  }
  local_5c = 1;
  for (iVar11 = 0; iVar11 < pGia->nObjs; iVar11 = iVar11 + 1) {
    pGVar8 = Gia_ManObj(pGia,iVar11);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      iVar4 = Gia_ObjRefNum(pGia,pGVar8);
      if (iVar4 < 1) {
        __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0xc2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
      }
      pGVar8->Value = uVar2;
      puVar7[(long)(int)uVar2 + 3] = uVar2;
      puVar7[(int)uVar2] = puVar7[(int)uVar2] & 0xf | 0x20;
      uVar5 = Gia_ObjRefNum(pGia,pGVar8);
      puVar7[(long)(int)uVar2 + 1] = uVar5;
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar7 + (int)uVar2),
                      (Frc_Obj_t *)(puVar7 + (int)pGVar8[-(*(ulong *)pGVar8 & 0x1fffffff)].Value));
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar7 + (int)uVar2),
                      (Frc_Obj_t *)
                      (puVar7 + (int)pGVar8[-((ulong)*(uint *)&pGVar8->field_0x4 & 0x1fffffff)].
                                     Value));
      uVar2 = puVar7[(long)(int)uVar2 + 1] + (puVar7[(int)uVar2] >> 4) + uVar2 + 6;
      local_5c = local_5c + 1;
      iVar10 = iVar10 + 1;
      pFVar6->nObjs = iVar10;
    }
  }
  for (iVar11 = 0; iVar11 < pGia->vCos->nSize; iVar11 = iVar11 + 1) {
    pGVar8 = Gia_ManCo(pGia,iVar11);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    pGVar8->Value = uVar2;
    Vec_IntPush(p_00,uVar2);
    puVar7[(long)(int)uVar2 + 3] = uVar2;
    uVar5 = puVar7[(int)uVar2];
    puVar7[(long)(int)uVar2 + 1] = 0;
    puVar7[(int)uVar2] = uVar5 & 0xd | 0x12;
    Frc_ObjAddFanin((Frc_Obj_t *)(puVar7 + (int)uVar2),
                    (Frc_Obj_t *)
                    (puVar7 + (int)pGVar8[-(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)].Value)
                   );
    uVar2 = puVar7[(long)(int)uVar2 + 1] + (puVar7[(int)uVar2] >> 4) + uVar2 + 6;
    pFVar6->nObjs = iVar10 + 1 + iVar11;
  }
  if ((local_5c - iVar10) + p->nSize + p_00->nSize != iVar11) {
    __assert_fail("nNodes == Frc_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0xe8,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
  }
  if (uVar2 != uVar1) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0xe9,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
  }
  for (iVar11 = 0; iVar11 < pGia->nObjs; iVar11 = iVar11 + 1) {
    pGVar8 = Gia_ManObj(pGia,iVar11);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    lVar9 = (long)(int)pGVar8->Value;
    if (lVar9 != -1) {
      if (puVar7[lVar9] >> 4 != puVar7[lVar9 + 5]) {
        __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0xf2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
      }
      if (puVar7[lVar9 + 1] != puVar7[lVar9 + 2]) {
        __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0xf3,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
      }
      puVar7[lVar9 + 2] = 0;
      puVar7[lVar9 + 5] = 0;
    }
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pFVar6;
}

Assistant:

Frc_Man_t * Frc_ManStartSimple( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;//, * pObjRi, * pObjRo;
    int i, nNodes, hHandle = 0;
    // prepare the AIG
    Gia_ManCreateRefs( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * Gia_ManObjNum(pGia) + 2 * (2 * Gia_ManAndNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes = 1;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 0;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 2;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin1(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStartSimple(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}